

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O3

void boost::deflate::deflate_stream_test::testWriteAfterFinish(ICompressor *c)

{
  ulong_long_type uVar1;
  bool bVar2;
  long *plVar3;
  int iVar4;
  uint extraout_var;
  undefined8 *puVar5;
  long lVar6;
  error_category *extraout_RDX;
  error_category *extraout_RDX_00;
  error_category *extraout_RDX_01;
  error_code eVar7;
  string out;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  (**c->_vptr_ICompressor)();
  local_40 = 0;
  local_38 = 0;
  local_48 = &local_38;
  std::__cxx11::string::resize((ulong)&local_48,'\0');
  (*c->_vptr_ICompressor[5])(c,"Hello");
  (*c->_vptr_ICompressor[3])(c,5);
  (*c->_vptr_ICompressor[9])(c,local_48);
  (*c->_vptr_ICompressor[7])(c,local_40);
  (*c->_vptr_ICompressor[0xc])(c,3);
  (**(code **)(*test_suite::detail::current()::p + 0x28 + (ulong)(extraout_var & 1) * 8))
            (test_suite::detail::current()::p,"!ec",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
             ,0x1d4,
             "static void boost::deflate::deflate_stream_test::testWriteAfterFinish(ICompressor &)")
  ;
  (*c->_vptr_ICompressor[5])(c,0);
  (*c->_vptr_ICompressor[3])(c,0);
  iVar4 = (*c->_vptr_ICompressor[0xc])(c,5);
  plVar3 = test_suite::detail::current()::p;
  eVar7 = make_error_code(end_of_stream);
  if (iVar4 == eVar7.val_) {
    uVar1 = (eVar7.cat_)->id_;
    bVar2 = extraout_RDX->id_ == uVar1;
    if (uVar1 == 0) {
      bVar2 = extraout_RDX == eVar7.cat_;
    }
    lVar6 = *plVar3;
    if (!bVar2) goto LAB_00108089;
    puVar5 = (undefined8 *)(lVar6 + 0x28);
  }
  else {
    lVar6 = *plVar3;
LAB_00108089:
    puVar5 = (undefined8 *)(lVar6 + 0x30);
  }
  (*(code *)*puVar5)(plVar3,"ec == error::end_of_stream",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
                     ,0x1d8,
                     "static void boost::deflate::deflate_stream_test::testWriteAfterFinish(ICompressor &)"
                    );
  (*c->_vptr_ICompressor[5])(c,"Hello");
  (*c->_vptr_ICompressor[3])(c,5);
  (*c->_vptr_ICompressor[9])(c,local_48);
  (*c->_vptr_ICompressor[7])(c,local_40);
  iVar4 = (*c->_vptr_ICompressor[0xc])(c,3);
  plVar3 = test_suite::detail::current()::p;
  eVar7 = make_error_code(stream_error);
  if (iVar4 == eVar7.val_) {
    uVar1 = (eVar7.cat_)->id_;
    bVar2 = extraout_RDX_00->id_ == uVar1;
    if (uVar1 == 0) {
      bVar2 = extraout_RDX_00 == eVar7.cat_;
    }
    lVar6 = *plVar3;
    if (!bVar2) goto LAB_0010813b;
    puVar5 = (undefined8 *)(lVar6 + 0x28);
  }
  else {
    lVar6 = *plVar3;
LAB_0010813b:
    puVar5 = (undefined8 *)(lVar6 + 0x30);
  }
  (*(code *)*puVar5)(plVar3,"ec == error::stream_error",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
                     ,0x1de,
                     "static void boost::deflate::deflate_stream_test::testWriteAfterFinish(ICompressor &)"
                    );
  iVar4 = (*c->_vptr_ICompressor[0xc])(c,5);
  plVar3 = test_suite::detail::current()::p;
  eVar7 = make_error_code(need_buffers);
  if (iVar4 == eVar7.val_) {
    uVar1 = (eVar7.cat_)->id_;
    bVar2 = extraout_RDX_01->id_ == uVar1;
    if (uVar1 == 0) {
      bVar2 = extraout_RDX_01 == eVar7.cat_;
    }
    lVar6 = *plVar3;
    if (bVar2) {
      puVar5 = (undefined8 *)(lVar6 + 0x28);
      goto LAB_001081b8;
    }
  }
  else {
    lVar6 = *plVar3;
  }
  puVar5 = (undefined8 *)(lVar6 + 0x30);
LAB_001081b8:
  (*(code *)*puVar5)(plVar3,"ec == error::need_buffers",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
                     ,0x1e0,
                     "static void boost::deflate::deflate_stream_test::testWriteAfterFinish(ICompressor &)"
                    );
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  return;
}

Assistant:

static
    void testWriteAfterFinish(ICompressor& c)
    {
        c.init();
        std::string out;
        out.resize(1024);
        string_view s = "Hello";
        c.next_in(s.data());
        c.avail_in(s.size());
        c.next_out(&out.front());
        c.avail_out(out.size());
        error_code ec = c.write(Flush::sync);
        BOOST_TEST(!ec);
        c.next_in(nullptr);
        c.avail_in(0);
        ec = c.write(Flush::finish);
        BOOST_TEST(ec == error::end_of_stream);
        c.next_in(s.data());
        c.avail_in(s.size());
        c.next_out(&out.front());
        c.avail_out(out.size());
        ec = c.write(Flush::sync);
        BOOST_TEST(ec == error::stream_error);
        ec = c.write(Flush::finish);
        BOOST_TEST(ec == error::need_buffers);
    }